

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallRuntimeDependencySetGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallRuntimeDependencySetGenerator::GenerateStripFixup
          (cmInstallRuntimeDependencySetGenerator *this,ostream *os,string *config,string *depName,
          Indent indent)

{
  bool bVar1;
  cmMakefile *pcVar2;
  string *psVar3;
  ulong uVar4;
  ostream *poVar5;
  string local_118;
  string local_f8;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  int local_8c;
  int local_88;
  allocator<char> local_71;
  string local_70;
  string local_50 [8];
  string strip;
  string *depName_local;
  string *config_local;
  ostream *os_local;
  cmInstallRuntimeDependencySetGenerator *this_local;
  Indent indent_local;
  
  strip.field_2._8_8_ = depName;
  this_local._4_4_ = indent.Level;
  pcVar2 = cmLocalGenerator::GetMakefile(this->LocalGenerator);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"CMAKE_STRIP",&local_71);
  psVar3 = cmMakefile::GetSafeDefinition(pcVar2,&local_70);
  std::__cxx11::string::string(local_50,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    local_88 = this_local._4_4_;
    poVar5 = ::operator<<(os,(cmScriptGeneratorIndent)this_local._4_4_);
    poVar5 = std::operator<<(poVar5,"if(CMAKE_INSTALL_DO_STRIP)\n");
    local_8c = (int)cmScriptGeneratorIndent::Next
                              ((cmScriptGeneratorIndent *)((long)&this_local + 4),2);
    poVar5 = ::operator<<(poVar5,(cmScriptGeneratorIndent)local_8c);
    poVar5 = std::operator<<(poVar5,"execute_process(COMMAND \"");
    poVar5 = std::operator<<(poVar5,local_50);
    std::operator<<(poVar5,"\" ");
    pcVar2 = cmLocalGenerator::GetMakefile(this->LocalGenerator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"CMAKE_HOST_SYSTEM_NAME",&local_b1);
    psVar3 = cmMakefile::GetSafeDefinition(pcVar2,&local_b0);
    bVar1 = std::operator==(psVar3,"Darwin");
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    if (bVar1) {
      std::operator<<(os,"-x ");
    }
    poVar5 = std::operator<<(os,"\"");
    GetDestination(&local_118,this,config);
    cmInstallGenerator::ConvertToAbsoluteDestination(&local_f8,&local_118);
    cmInstallGenerator::GetDestDirPath(&local_d8,&local_f8);
    poVar5 = std::operator<<(poVar5,(string *)&local_d8);
    poVar5 = std::operator<<(poVar5,"/");
    poVar5 = std::operator<<(poVar5,(string *)strip.field_2._8_8_);
    poVar5 = std::operator<<(poVar5,"\")\n");
    poVar5 = ::operator<<(poVar5,(cmScriptGeneratorIndent)this_local._4_4_);
    std::operator<<(poVar5,"endif()\n");
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
  }
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void cmInstallRuntimeDependencySetGenerator::GenerateStripFixup(
  std::ostream& os, const std::string& config, const std::string& depName,
  Indent indent)
{
  std::string strip =
    this->LocalGenerator->GetMakefile()->GetSafeDefinition("CMAKE_STRIP");
  if (!strip.empty()) {
    os << indent << "if(CMAKE_INSTALL_DO_STRIP)\n"
       << indent.Next() << "execute_process(COMMAND \"" << strip << "\" ";
    if (this->LocalGenerator->GetMakefile()->GetSafeDefinition(
          "CMAKE_HOST_SYSTEM_NAME") == "Darwin") {
      os << "-x ";
    }
    os << "\""
       << GetDestDirPath(
            ConvertToAbsoluteDestination(this->GetDestination(config)))
       << "/" << depName << "\")\n"
       << indent << "endif()\n";
  }
}